

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

int get_object_id(char *s,char c)

{
  char *__s2;
  int iVar1;
  int local_3c;
  int local_38;
  int local_34;
  char *objname;
  int local_20;
  int class;
  int i;
  char c_local;
  char *s_local;
  
  if (c < '\x01') {
    local_34 = 0;
  }
  else {
    local_34 = def_char_to_objclass(c);
  }
  if (local_34 != 0x12) {
    if (local_34 == 0) {
      local_38 = 0;
    }
    else {
      local_38 = bases[local_34];
    }
    local_20 = local_38;
    while ((local_20 < 0x21a && ((local_34 == 0 || (objects[local_20].oc_class == local_34))))) {
      if ((obj_descr[local_20].oc_name != (char *)0x0) &&
         (iVar1 = strcmp(s,obj_descr[local_20].oc_name), iVar1 == 0)) {
        return local_20;
      }
      local_20 = local_20 + 1;
    }
    if (local_34 == 0) {
      local_3c = 0;
    }
    else {
      local_3c = bases[local_34];
    }
    local_20 = local_3c;
    while ((local_20 < 0x21a && ((local_34 == 0 || (objects[local_20].oc_class == local_34))))) {
      __s2 = obj_descr[local_20].oc_name;
      if ((__s2 != (char *)0x0) && (iVar1 = strcasecmp(s,__s2), iVar1 == 0)) {
        if (be_verbose != 0) {
          lc_warning("Object type \"%s\" matches \"%s\".",s,__s2);
        }
        return local_20;
      }
      local_20 = local_20 + 1;
    }
  }
  return -1;
}

Assistant:

int get_object_id(char *s, char c)
{
	int i, class;
	const char *objname;

	class = (c > 0) ? def_char_to_objclass(c) : 0;
	if (class == MAXOCLASSES) return ERR;

	for (i = class ? bases[class] : 0; i < NUM_OBJECTS; i++) {
	    if (class && objects[i].oc_class != class) break;
	    objname = obj_descr[i].oc_name;
	    if (objname && !strcmp(s, objname))
		return i;
	}

	for (i = class ? bases[class] : 0; i < NUM_OBJECTS; i++) {
	    if (class && objects[i].oc_class != class) break;
	    objname = obj_descr[i].oc_name;
	    if (objname && !strcasecmp(s, objname)) {
		if (be_verbose)
		    lc_warning("Object type \"%s\" matches \"%s\".", s, objname);
		return i;
	    }
	}

	return ERR;
}